

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargePropagator.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargePropagator::~FluctuatingChargePropagator(FluctuatingChargePropagator *this)

{
  FluctuatingChargeConstraints *pFVar1;
  pointer pdVar2;
  pointer piVar3;
  
  this->_vptr_FluctuatingChargePropagator = (_func_int **)&PTR__FluctuatingChargePropagator_00302430
  ;
  if (((this->info_->usesFluctuatingCharges_ == true) &&
      (0 < this->info_->nGlobalFluctuatingCharges_)) &&
     (pFVar1 = this->fqConstraints_, pFVar1 != (FluctuatingChargeConstraints *)0x0)) {
    pdVar2 = (pFVar1->regionChargeMass_).super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (pdVar2 != (pointer)0x0) {
      operator_delete(pdVar2,(long)(pFVar1->regionChargeMass_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
    }
    piVar3 = (pFVar1->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3,(long)(pFVar1->regionCharges_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar3);
    }
    pdVar2 = (pFVar1->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar2 != (pointer)0x0) {
      operator_delete(pdVar2,(long)(pFVar1->regionCMom_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
    }
    pdVar2 = (pFVar1->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar2 != (pointer)0x0) {
      operator_delete(pdVar2,(long)(pFVar1->regionForce_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
    }
    piVar3 = (pFVar1->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3,(long)(pFVar1->regionKeys_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar3);
    }
    operator_delete(pFVar1,0x88);
    return;
  }
  return;
}

Assistant:

FluctuatingChargePropagator::~FluctuatingChargePropagator() {
    if (info_->usesFluctuatingCharges() && info_->getNFluctuatingCharges() > 0)
      delete fqConstraints_;
  }